

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::resend_request(upnp *this,error_code *ec)

{
  size_t sVar1;
  undefined8 extraout_RDX;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  undefined1 auVar4 [16];
  shared_ptr<libtorrent::upnp> me;
  error_code local_28;
  
  if (ec->failed_ != false) {
    return;
  }
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  if (this->m_closing == false) {
    sVar1 = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (this->m_retry_count < 0xc) {
      bVar3 = sVar1 != 0;
      sVar1 = CONCAT71((int7)(sVar1 >> 8),bVar3);
      if (this->m_retry_count < 4 || !bVar3) {
        discover_device_impl(this);
        goto LAB_00331604;
      }
    }
    else if (sVar1 == 0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_28,no_router,(type *)0x0);
      disable(this,&local_28);
      goto LAB_00331604;
    }
    auVar4._8_8_ = extraout_RDX;
    auVar4._0_8_ = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      p_Var2 = auVar4._0_8_;
      if ((_Rb_tree_header *)p_Var2 == &(this->m_devices)._M_t._M_impl.super__Rb_tree_header) break;
      if (((p_Var2[2]._M_parent == (_Base_ptr)0x0) && (p_Var2[8]._M_parent == (_Base_ptr)0x0)) &&
         (*(byte *)((long)&p_Var2[8]._M_color + 2) == 0)) {
        connect(this,auVar4._0_4_ + 0x20,auVar4._8_8_,(socklen_t)sVar1);
      }
      auVar4 = ::std::_Rb_tree_increment(p_Var2);
    }
  }
LAB_00331604:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void upnp::resend_request(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::resend_request");
	if (ec) return;

	std::shared_ptr<upnp> me(self());

	if (m_closing) return;

	if (m_retry_count < 12
		&& (m_devices.empty() || m_retry_count < 4))
	{
		discover_device_impl();
		return;
	}

	if (m_devices.empty())
	{
		disable(errors::no_router);
		return;
	}

	for (auto const& dev : m_devices)
	{
		if (!dev.control_url.empty()
			|| dev.upnp_connection
			|| dev.disabled)
		{
			continue;
		}

		// we don't have a WANIP or WANPPP url for this device,
		// ask for it
		connect(const_cast<rootdevice&>(dev));
	}
}